

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void alBufferSamplesSOFT(ALuint param_1,ALuint param_2,ALenum param_3,ALsizei param_4,ALenum param_5
                        ,ALenum param_6,ALvoid *param_7)

{
  bool bVar1;
  ALCcontext *this;
  ContextRef context;
  undefined4 in_stack_ffffffffffffffd4;
  intrusive_ptr<ALCcontext> local_20 [4];
  
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)local_20);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (!bVar1) {
    this = al::intrusive_ptr<ALCcontext>::operator->(local_20);
    ALCcontext::setError(this,0xa004,"alBufferSamplesSOFT not supported");
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)CONCAT44(in_stack_ffffffffffffffd4,(uint)bVar1));
  return;
}

Assistant:

END_API_FUNC


AL_API void AL_APIENTRY alBufferSamplesSOFT(ALuint /*buffer*/, ALuint /*samplerate*/,
    ALenum /*internalformat*/, ALsizei /*samples*/, ALenum /*channels*/, ALenum /*type*/,
    const ALvoid* /*data*/)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    context->setError(AL_INVALID_OPERATION, "alBufferSamplesSOFT not supported");
}